

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void UncolorAtomicMergeSet(VmInstruction *inst)

{
  VmValue **ppVVar1;
  VmInstruction *pVVar2;
  uint argument;
  uint uVar3;
  
  inst->color = 0;
  if (inst->cmd == VM_INST_PHI) {
    for (uVar3 = 0; uVar3 < (inst->arguments).count; uVar3 = uVar3 + 2) {
      ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,uVar3);
      pVVar2 = (VmInstruction *)*ppVVar1;
      if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
        pVVar2 = (VmInstruction *)0x0;
      }
      if (pVVar2->color != 0) {
        UncolorAtomicMergeSet(pVVar2);
      }
    }
  }
  for (uVar3 = 0; uVar3 < (inst->super_VmValue).users.count; uVar3 = uVar3 + 1) {
    ppVVar1 = SmallArray<VmValue_*,_8U>::operator[](&(inst->super_VmValue).users,uVar3);
    pVVar2 = (VmInstruction *)*ppVVar1;
    if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
      pVVar2 = (VmInstruction *)0x0;
    }
    if (pVVar2->cmd == VM_INST_PHI) {
      UncolorAtomicMergeSet(pVVar2);
    }
  }
  return;
}

Assistant:

void UncolorAtomicMergeSet(VmInstruction *inst)
{
	inst->color = 0;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			if(instruction->color != 0)
				UncolorAtomicMergeSet(instruction);
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			UncolorAtomicMergeSet(instruction);
	}
}